

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLoader.cpp
# Opt level: O0

void __thiscall
slang::driver::SourceLoader::addSearchDirectories(SourceLoader *this,string_view pattern)

{
  bool bVar1;
  error_code ec;
  SmallVector<std::filesystem::__cxx11::path,_2UL> directories;
  bool in_stack_000001a7;
  SmallVector<std::filesystem::__cxx11::path,_2UL> *in_stack_000001a8;
  GlobMode in_stack_000001b4;
  path *in_stack_000001b8;
  undefined1 in_stack_000001c0 [16];
  error_code *in_stack_000001e0;
  path *this_00;
  path *in_stack_fffffffffffffe80;
  path *__last;
  path *__first;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *this_01;
  const_iterator in_stack_fffffffffffffec8;
  path *in_stack_fffffffffffffed0;
  SourceLoader *in_stack_fffffffffffffef8;
  error_code in_stack_ffffffffffffff00;
  path local_b8;
  undefined1 local_90 [16];
  SmallVectorBase<std::filesystem::__cxx11::path> local_80 [2];
  
  this_01 = (vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             *)(local_90 + 0x10);
  SmallVector<std::filesystem::__cxx11::path,_2UL>::SmallVector
            ((SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x26162e);
  this_00 = (path *)local_90;
  std::error_code::error_code((error_code *)in_stack_fffffffffffffe80);
  __first = &local_b8;
  std::filesystem::__cxx11::path::path(in_stack_fffffffffffffe80);
  __last = this_00;
  svGlob(in_stack_000001b8,(string_view)in_stack_000001c0,in_stack_000001b4,in_stack_000001a8,
         in_stack_000001a7,in_stack_000001e0);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe80);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_90);
  if (bVar1) {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (in_stack_fffffffffffffed0,
               (basic_string_view<char,_std::char_traits<char>_> *)
               in_stack_fffffffffffffec8._M_current,(format)((ulong)this_01 >> 0x38));
    addError(in_stack_fffffffffffffef8,(path *)local_90._8_8_,in_stack_ffffffffffffff00);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe80);
  }
  else {
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    end((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *)
        this_00);
    __gnu_cxx::
    __normal_iterator<std::filesystem::__cxx11::path_const*,std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>>
    ::__normal_iterator<std::filesystem::__cxx11::path*>
              ((__normal_iterator<const_std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                *)in_stack_fffffffffffffe80,
               (__normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                *)this_00);
    SmallVectorBase<std::filesystem::__cxx11::path>::begin
              ((SmallVectorBase<std::filesystem::__cxx11::path> *)(local_90 + 0x10));
    SmallVectorBase<std::filesystem::__cxx11::path>::end
              ((SmallVectorBase<std::filesystem::__cxx11::path> *)(local_90 + 0x10));
    std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
    insert<std::filesystem::__cxx11::path*,void>(this_01,in_stack_fffffffffffffec8,__first,__last);
  }
  SmallVector<std::filesystem::__cxx11::path,_2UL>::~SmallVector
            ((SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x261806);
  return;
}

Assistant:

void SourceLoader::addSearchDirectories(std::string_view pattern) {
    SmallVector<fs::path> directories;
    std::error_code ec;
    svGlob({}, pattern, GlobMode::Directories, directories, /* expandEnvVars */ false, ec);
    if (ec) {
        addError(pattern, ec);
        return;
    }

    searchDirectories.insert(searchDirectories.end(), directories.begin(), directories.end());
}